

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O1

int __thiscall FSectorTagIterator::Next(FSectorTagIterator *this)

{
  uint uVar1;
  FTagItem *pFVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  
  pFVar2 = tagManager.allTags.Array;
  iVar3 = numsectors;
  if (this->searchtag == 0) {
    uVar1 = this->start;
    uVar5 = uVar1;
    if ((int)uVar1 < numsectors) {
      piVar4 = tagManager.startForSector.Array + uVar1;
      uVar6 = uVar1;
      do {
        uVar5 = uVar6;
        if ((((int)uVar1 < 0) || ((int)tagManager.startForSector.Count <= (int)uVar6)) ||
           (*piVar4 < 0)) break;
        uVar6 = uVar6 + 1;
        this->start = uVar6;
        piVar4 = piVar4 + 1;
        uVar5 = iVar3;
      } while ((int)uVar6 < iVar3);
    }
    if (uVar5 == iVar3) {
      return -1;
    }
    iVar3 = uVar5 + 1;
  }
  else {
    uVar1 = this->start;
    while ((-1 < (int)uVar1 && (pFVar2[uVar1].tag != this->searchtag))) {
      uVar1 = pFVar2[uVar1].nexttag;
      this->start = uVar1;
    }
    if (uVar1 == 0xffffffff) {
      return -1;
    }
    uVar5 = tagManager.allTags.Array[(int)uVar1].target;
    iVar3 = tagManager.allTags.Array[(int)uVar1].nexttag;
  }
  this->start = iVar3;
  return uVar5;
}

Assistant:

int FSectorTagIterator::Next()
{
	int ret;
	if (searchtag == INT_MIN)
	{
		ret = start;
		start = -1;
	}
	else if (searchtag != 0)
	{
		while (start >= 0 && tagManager.allTags[start].tag != searchtag) start = tagManager.allTags[start].nexttag;
		if (start == -1) return -1;
		ret = tagManager.allTags[start].target;
		start = tagManager.allTags[start].nexttag;
	}
	else
	{
		// with the tag manager, searching for tag 0 has to be different, because it won't create entries for untagged sectors.
		while (start < numsectors && tagManager.SectorHasTags(start))
		{
			start++;
		}
		if (start == numsectors) return -1;
		ret = start;
		start++;
	}
	return ret;
}